

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.hpp
# Opt level: O3

void __thiscall
Diligent::FunctionStubHashKey::FunctionStubHashKey
          (FunctionStubHashKey *this,String *_Obj,String *_Func,Uint32 _NumArgs)

{
  HashMapStringKey::HashMapStringKey(&this->Object,(_Obj->_M_dataplus)._M_p,true);
  HashMapStringKey::HashMapStringKey(&this->Function,(_Func->_M_dataplus)._M_p,true);
  this->NumArguments = _NumArgs;
  return;
}

Assistant:

FunctionStubHashKey(const String& _Obj,  const String& _Func, Uint32 _NumArgs) :
        Object      {_Obj    },
        Function    {_Func   },
        NumArguments{_NumArgs}
    {
    }